

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O3

void __thiscall
phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>
::internal_clear(btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>
                 *this,node_type *node)

{
  btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>
  *node_00;
  ulong i;
  
  if (((ulong)node & 7) != 0) {
    __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap_base.h"
                  ,0xf84,
                  "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::set_params<int, phmap::Less<int>, std::allocator<int>, 256, false>> *, unsigned char, int, phmap::priv::btree_node<phmap::priv::set_params<int, phmap::Less<int>, std::allocator<int>, 256, false>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::set_params<int, phmap::Less<int>, std::allocator<int>, 256, false>> *, unsigned char, int, phmap::priv::btree_node<phmap::priv::set_params<int, phmap::Less<int>, std::allocator<int>, 256, false>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 1UL, Char = const char]"
                 );
  }
  if (node[0xb] != (node_type)0x0) {
    delete_leaf_node(this,node);
    return;
  }
  i = 0xffffffffffffffff;
  do {
    i = i + 1;
    node_00 = btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>
              ::child(node,i);
    internal_clear(this,node_00);
  } while (i < (byte)node[10]);
  delete_internal_node(this,node);
  return;
}

Assistant:

void btree<P>::internal_clear(node_type *node) {
        if (!node->leaf()) {
            for (int i = 0; i <= node->count(); ++i) {
                internal_clear(node->child(i));
            }
            delete_internal_node(node);
        } else {
            delete_leaf_node(node);
        }
    }